

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip32.c
# Opt level: O1

int bip32_key_from_base58(char *base58,ext_key *output)

{
  int iVar1;
  size_t written;
  uchar bytes [82];
  size_t local_70;
  uchar local_68 [88];
  
  iVar1 = wally_base58_to_bytes(base58,1,local_68,0x52,&local_70);
  if (iVar1 == 0) {
    iVar1 = -2;
    if (local_70 == 0x4e) {
      iVar1 = bip32_key_unserialize(local_68,0x4e,output);
    }
    wally_clear(local_68,0x52);
  }
  return iVar1;
}

Assistant:

int bip32_key_from_base58(const char *base58,
                          struct ext_key *output)
{
    int ret;
    unsigned char bytes[BIP32_SERIALIZED_LEN + BASE58_CHECKSUM_LEN];
    size_t written;

    if ((ret = wally_base58_to_bytes(base58, BASE58_FLAG_CHECKSUM, bytes, sizeof(bytes), &written)))
        return ret;

    if (written != BIP32_SERIALIZED_LEN)
        ret = WALLY_EINVAL;
    else
        ret = bip32_key_unserialize(bytes, BIP32_SERIALIZED_LEN, output);

    wally_clear(bytes, sizeof(bytes));
    return ret;
}